

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O2

int append_str(CharBuff *buff,char *c)

{
  ulong uVar1;
  int iVar2;
  unsigned_long uVar3;
  ulong uVar4;
  
  uVar3 = str_len_(c);
  uVar1 = 0;
  do {
    uVar4 = uVar1;
    if (uVar3 == uVar4) break;
    iVar2 = sbuff_write(buff,c[uVar4]);
    uVar1 = uVar4 + 1;
  } while (iVar2 != 0);
  return (int)(uVar3 <= uVar4);
}

Assistant:

int append_str(CharBuff* buff, const char *c){
    unsigned long len = str_len_(c);
    for (int i = 0; i < len; ++i) {
        if (sbuff_write(buff, c[i])  == 0)return false;
    }
    return true;
}